

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

void __thiscall
GlassMaterial::GlassMaterial
          (GlassMaterial *this,float coef,Texture *reflect_color,Texture *refract_color,
          float thickness)

{
  BRDFMaterial *this_00;
  float fVar1;
  Vector3f local_174;
  Vector3f local_168;
  Vector3f local_15c;
  Texture local_150;
  Texture local_e8;
  Texture local_80;
  
  (this->super_Material)._vptr_Material = (_func_int **)&PTR_shade_002169a8;
  Texture::Texture(&this->reflectColor,reflect_color);
  Texture::Texture(&this->refractColor,refract_color);
  this->thickness = thickness;
  fVar1 = 1.0 / coef;
  this->refractCoef = fVar1;
  fVar1 = (1.0 - fVar1) / (fVar1 + 1.0);
  this->r0 = fVar1 * fVar1;
  this_00 = (BRDFMaterial *)operator_new(0x148);
  Vector3f::Vector3f(&local_15c,0.5,0.5,0.5);
  Texture::Texture(&local_80,&local_15c);
  Vector3f::Vector3f(&local_168,0.5,0.5,0.5);
  Texture::Texture(&local_e8,&local_168);
  Vector3f::Vector3f(&local_174,&Vector3f::ZERO);
  Texture::Texture(&local_150,&local_174);
  BRDFMaterial::BRDFMaterial(this_00,&local_80,&local_e8,0.3,&local_150);
  this->m = this_00;
  std::_Function_base::~_Function_base(&local_150.scale.super__Function_base);
  std::_Function_base::~_Function_base(&local_e8.scale.super__Function_base);
  std::_Function_base::~_Function_base(&local_80.scale.super__Function_base);
  return;
}

Assistant:

GlassMaterial(float coef = 1,
		const Texture & reflect_color = Vector3f::ZERO,
		const Texture & refract_color = Vector3f::ZERO,
		float thickness = 0) :
		refractCoef(coef),
		reflectColor(reflect_color), refractColor(refract_color),
		thickness(thickness) {
		refractCoef = 1 / refractCoef;
		r0 = (1 - refractCoef) / (1 + refractCoef); r0 *= r0;
		m = new BRDFMaterial(Vector3f(0.5, 0.5, 0.5), Vector3f(0.5, 0.5, 0.5), 0.3);
	}